

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

statement_base * __thiscall
cs::method_while::translate
          (method_while *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  int iVar1;
  element_type *ptr_00;
  token_base *ptr_01;
  token_base **pptVar2;
  bool *pbVar3;
  statement_base *psVar4;
  shared_ptr<cs::context_type> *this_00;
  token_base *ptr;
  tree_type<cs::token_base_*> *tree;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> body;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffd68;
  compiler_type *in_stack_fffffffffffffd70;
  _Self *in_stack_fffffffffffffd78;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffd80;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_01;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *b;
  statement_loop *this_02;
  tree_type<cs::token_base_*> *tree_00;
  statement_while *this_03;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  element_type *in_stack_fffffffffffffde0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffde8;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *in_stack_fffffffffffffdf0;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffe28;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *in_stack_fffffffffffffe30;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> local_1b0;
  tree_node *local_150;
  token_value *local_148;
  tree_type<cs::token_base_*> *local_140;
  undefined1 local_121 [65];
  statement_loop local_e0;
  statement_base *local_8;
  
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x5653dc);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5653e9);
  ptr_00 = std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x5653f1);
  b = (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)(local_121 + 0x21);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::begin(in_stack_fffffffffffffd68);
  this_02 = &local_e0;
  std::operator+(in_stack_fffffffffffffd78,(difference_type)in_stack_fffffffffffffd70);
  tree_00 = (tree_type<cs::token_base_*> *)(local_121 + 1);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::end(in_stack_fffffffffffffd68);
  this_03 = (statement_while *)local_121;
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x565458
            );
  std::
  deque<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::allocator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>>>
  ::
  deque<std::_Deque_iterator<std::deque<cs::token_base*,std::allocator<cs::token_base*>>,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const&,std::deque<cs::token_base*,std::allocator<cs::token_base*>>const*>,void>
            (in_stack_fffffffffffffdf0,
             (_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
              *)in_stack_fffffffffffffde8._M_pi,
             (_Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_const_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
              *)in_stack_fffffffffffffde0,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
  compiler_type::translate
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)0x565490);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::~deque((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
            *)this_02);
  std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>::~allocator
            ((allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_> *)0x5654ac
            );
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffd80);
  ptr_01 = (token_base *)
           std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                     ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                      in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
  local_140 = token_expr::get_tree((token_expr *)ptr_01->_vptr_token_base);
  local_150 = (tree_node *)
              tree_type<cs::token_base_*>::root
                        ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffd68);
  pptVar2 = tree_type<cs::token_base_*>::iterator::data((iterator *)ptr_00);
  local_148 = (token_value *)*pptVar2;
  if (local_148 != (token_value *)0x0) {
    iVar1 = (*(local_148->super_token_base)._vptr_token_base[2])();
    if (iVar1 == 7) {
      token_value::get_value(local_148);
      pbVar3 = cs_impl::any::const_val<bool>((any *)in_stack_fffffffffffffdf0);
      if ((*pbVar3 & 1U) == 0) {
        local_8 = (statement_base *)0x0;
      }
      else {
        psVar4 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffd70);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        this_01 = &local_1b0;
        std::shared_ptr<cs::context_type>::shared_ptr
                  ((shared_ptr<cs::context_type> *)in_stack_fffffffffffffd70,
                   (shared_ptr<cs::context_type> *)in_stack_fffffffffffffd68);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)this_01);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(this_01);
        statement_loop::statement_loop(this_02,b,(context_t *)ptr_00,ptr_01);
        local_8 = psVar4;
        std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x565614);
        std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
                  ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_02);
      }
      goto LAB_00565885;
    }
  }
  psVar4 = (statement_base *)statement_base::operator_new((size_t)in_stack_fffffffffffffd70);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffd80);
  this_00 = (shared_ptr<cs::context_type> *)
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68);
  token_expr::get_tree
            ((token_expr *)
             (this_00->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  tree_type<cs::token_base_*>::tree_type
            ((tree_type<cs::token_base_*> *)this_00,
             (tree_type<cs::token_base_*> *)in_stack_fffffffffffffd68);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::shared_ptr<cs::context_type>::shared_ptr
            (this_00,(shared_ptr<cs::context_type> *)&stack0xfffffffffffffde0);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffd80);
  std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(in_stack_fffffffffffffd80);
  statement_while::statement_while
            (this_03,tree_00,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_02,
             (context_t *)b,(token_base *)ptr_00);
  local_8 = psVar4;
  std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x5657e5);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_02);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x5657ff);
LAB_00565885:
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)this_02);
  return local_8;
}

Assistant:

statement_base *method_while::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		std::deque<statement_base *> body;
		context->compiler->translate({raw.begin() + 1, raw.end()}, body);
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		token_base *ptr = tree.root().data();
		if (ptr != nullptr && ptr->get_type() == token_types::value) {
			if (static_cast<token_value *>(ptr)->get_value().const_val<bool>())
				return new statement_loop(body, context, raw.front().back());
			else
				return nullptr;
		}
		else
			return new statement_while(static_cast<token_expr *>(raw.front().at(1))->get_tree(), body, context,
			                           raw.front().back());
	}